

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mau.cpp
# Opt level: O3

MauResult mau_proxy_create(MauProxyConfig *config,MauChannelConfig *channel,char *hostname,
                          uint16_t port,MauProxy *proxyOut)

{
  int iVar1;
  MauResult MVar2;
  OutputWorker *this;
  ProxySession *this_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&LoggerLock);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  if (LoggerRefs == 0) {
    this = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Start(this);
  }
  LoggerRefs = LoggerRefs + 1;
  pthread_mutex_unlock((pthread_mutex_t *)&LoggerLock);
  MVar2 = Mau_InvalidInput;
  if (proxyOut == (MauProxy *)0x0 || config == (MauProxyConfig *)0x0) {
    if (proxyOut == (MauProxy *)0x0) goto LAB_00106b71;
  }
  else if ((((config->Version == 3) &&
            ((((config->SendHook != (MauSendHookFunction)0x0 ||
               (((0xffff0000 < config->UDPListenPort - 0x10000 &&
                 (2000 < config->UDPRecvBufferSizeBytes)) && (2000 < config->UDPSendBufferSizeBytes)
                ))) && (((config->MaxDatagramBytes != 0 && (0.0 <= channel->LossRate)) &&
                        (channel->LossRate <= 1.0)))) &&
             ((0.0 <= channel->DeliveryRate && (channel->DeliveryRate <= 1.0)))))) &&
           ((0.01 < channel->Router_MBPS &&
            ((((10 < channel->Router_QueueMsec &&
               (channel->ReorderMinimumLatencyMsec <= channel->ReorderMaximumLatencyMsec)) &&
              (0.0 <= channel->ReorderRate)) &&
             ((channel->ReorderRate <= 1.0 && (0.0 <= channel->OrderRate)))))))) &&
          ((channel->OrderRate <= 1.0 &&
           (((0.0 <= channel->DuplicateRate && (channel->DuplicateRate <= 1.0)) &&
            ((0.0 <= channel->CorruptionRate && (channel->CorruptionRate <= 1.0)))))))) {
    this_00 = (ProxySession *)operator_new(0x5d0,(nothrow_t *)&std::nothrow);
    if (this_00 == (ProxySession *)0x0) {
      MVar2 = Mau_OOM;
    }
    else {
      mau::DeliveryCommonData::DeliveryCommonData((DeliveryCommonData *)this_00);
      auVar3 = ZEXT816(0) << 0x40;
      (this_00->ServerHostname)._M_dataplus._M_p = (pointer)&(this_00->ServerHostname).field_2;
      (this_00->ServerHostname)._M_string_length = 0;
      (this_00->ServerHostname).field_2._M_local_buf[0] = '\0';
      this_00->ServerPort = 0;
      *(undefined8 *)((long)&(this_00->SourceAddress).impl_.data_ + 8) = 0;
      *(undefined8 *)((long)&(this_00->SourceAddress).impl_.data_ + 0x10) = 0;
      (this_00->SourceAddress).impl_.data_.v6.sin6_scope_id = 0;
      *(undefined8 *)&(this_00->SourceAddress).impl_.data_ = 2;
      *(undefined1 (*) [32])&(this_00->APILock).cs.super___recursive_mutex_base._M_mutex =
           ZEXT1632(auVar3);
      (this_00->APILock).cs.super___recursive_mutex_base._M_mutex.__data.__list.__next =
           (__pthread_internal_list *)0x0;
      (this_00->APILock).cs.super___recursive_mutex_base._M_mutex.__data.__kind = 1;
      (this_00->Terminated)._M_base._M_i = false;
      *(undefined1 (*) [32])&this_00->Thread = ZEXT1632(auVar3);
      auVar4 = ZEXT1632(auVar3);
      *(undefined1 (*) [32])
       ((long)&(this_00->ClientAddress).TheLock.cs.super___recursive_mutex_base._M_mutex + 8) =
           auVar4;
      (this_00->ClientAddress).TheLock.cs.super___recursive_mutex_base._M_mutex.__data.__kind = 1;
      (this_00->ClientAddress).Value.impl_.data_.v6.sin6_scope_id = 0;
      *(undefined8 *)((long)&(this_00->ClientAddress).Value.impl_.data_ + 8) = 0;
      *(undefined8 *)((long)&(this_00->ClientAddress).Value.impl_.data_ + 0x10) = 0;
      *(undefined8 *)&(this_00->ClientAddress).Value.impl_.data_ = 2;
      (this_00->ServerAddress).TheLock.cs.super___recursive_mutex_base._M_mutex.__data.__list.__next
           = (__pthread_internal_list *)0x0;
      *(undefined1 (*) [32])
       &(this_00->ServerAddress).TheLock.cs.super___recursive_mutex_base._M_mutex = auVar4;
      (this_00->ServerAddress).TheLock.cs.super___recursive_mutex_base._M_mutex.__data.__kind = 1;
      (this_00->ServerAddress).Value.impl_.data_.v6.sin6_scope_id = 0;
      *(undefined8 *)((long)&(this_00->ServerAddress).Value.impl_.data_ + 8) = 0;
      *(undefined8 *)((long)&(this_00->ServerAddress).Value.impl_.data_ + 0x10) = 0;
      *(undefined8 *)&(this_00->ServerAddress).Value.impl_.data_ = 2;
      *(undefined1 (*) [32])
       ((long)&(this_00->C2S).DeliveryAddress.TheLock.cs.super___recursive_mutex_base._M_mutex + 8)
           = auVar4;
      *(undefined1 (*) [32])&this_00->C2S = auVar4;
      (this_00->C2S).DeliveryAddress.TheLock.cs.super___recursive_mutex_base._M_mutex.__data.__kind
           = 1;
      (this_00->C2S).DeliveryAddress.Value.impl_.data_.v6.sin6_scope_id = 0;
      *(undefined8 *)((long)&(this_00->C2S).DeliveryAddress.Value.impl_.data_ + 8) = 0;
      *(undefined8 *)((long)&(this_00->C2S).DeliveryAddress.Value.impl_.data_ + 0x10) = 0;
      *(undefined8 *)&(this_00->C2S).DeliveryAddress.Value.impl_.data_ = 2;
      (this_00->C2S).QueueLock.cs.super___recursive_mutex_base._M_mutex.__data.__list.__next =
           (__pthread_internal_list *)0x0;
      auVar4 = ZEXT1632(auVar3);
      *(undefined1 (*) [32])&(this_00->C2S).QueueLock.cs.super___recursive_mutex_base._M_mutex =
           auVar4;
      (this_00->C2S).QueueLock.cs.super___recursive_mutex_base._M_mutex.__data.__kind = 1;
      (this_00->C2S).Queue.Head = (QueueNode *)0x0;
      (this_00->C2S).Queue.Tail = (QueueNode *)0x0;
      (this_00->C2S).NextTimerWakeUsec = 0;
      (this_00->C2S).InsertLock.cs.super___recursive_mutex_base._M_mutex.__align = 0;
      *(undefined8 *)((long)&(this_00->C2S).InsertLock.cs.super___recursive_mutex_base._M_mutex + 8)
           = 0;
      *(undefined8 *)
       ((long)&(this_00->C2S).InsertLock.cs.super___recursive_mutex_base._M_mutex + 0x10) = 0;
      (this_00->C2S).InsertLock.cs.super___recursive_mutex_base._M_mutex.__data.__list.__prev =
           (__pthread_internal_list *)0x0;
      (this_00->C2S).InsertLock.cs.super___recursive_mutex_base._M_mutex.__data.__list.__next =
           (__pthread_internal_list *)0x0;
      (this_00->C2S).InsertLock.cs.super___recursive_mutex_base._M_mutex.__data.__kind = 1;
      (this_00->C2S).InBurstLoss = false;
      (this_00->C2S).InBurstReorder = false;
      (this_00->C2S).LossRNG.Inc = 0;
      (this_00->S2C).DeliveryTimer._M_t.
      super___uniq_ptr_impl<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_*,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
      .
      super__Head_base<0UL,_asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_*,_false>
      ._M_head_impl =
           (basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
            *)0x0;
      (this_00->S2C).Common = (DeliveryCommonData *)0x0;
      (this_00->S2C).DeliveryAddress.TheLock.cs.super___recursive_mutex_base._M_mutex.__align = 0;
      *(undefined8 *)
       ((long)&(this_00->S2C).DeliveryAddress.TheLock.cs.super___recursive_mutex_base._M_mutex + 8)
           = 0;
      *(undefined8 *)
       ((long)&(this_00->S2C).DeliveryAddress.TheLock.cs.super___recursive_mutex_base._M_mutex +
       0x10) = 0;
      (this_00->S2C).DeliveryAddress.TheLock.cs.super___recursive_mutex_base._M_mutex.__data.__list.
      __prev = (__pthread_internal_list *)0x0;
      *(__pthread_internal_list **)
       ((long)&(this_00->S2C).DeliveryAddress.TheLock.cs.super___recursive_mutex_base._M_mutex.
               __data.__list + 8) = (__pthread_internal_list *)0x0;
      (this_00->C2S).NextQueueSlotUsec = 0;
      (this_00->C2S).LossRNG.State = 0;
      (this_00->C2S).LossRNG.Inc = 0;
      (this_00->S2C).DeliveryTimer._M_t.
      super___uniq_ptr_impl<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_*,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
      .
      super__Head_base<0UL,_asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_*,_false>
      ._M_head_impl =
           (basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
            *)0x0;
      (this_00->S2C).Common = (DeliveryCommonData *)0x0;
      (this_00->S2C).DeliveryAddress.TheLock.cs.super___recursive_mutex_base._M_mutex.__align = 0;
      *(undefined8 *)
       ((long)&(this_00->S2C).DeliveryAddress.TheLock.cs.super___recursive_mutex_base._M_mutex + 8)
           = 0;
      *(undefined8 *)
       ((long)&(this_00->S2C).DeliveryAddress.TheLock.cs.super___recursive_mutex_base._M_mutex +
       0x10) = 0;
      (this_00->S2C).DeliveryAddress.TheLock.cs.super___recursive_mutex_base._M_mutex.__data.__kind
           = 1;
      (this_00->S2C).DeliveryAddress.Value.impl_.data_.v6.sin6_scope_id = 0;
      *(undefined8 *)((long)&(this_00->S2C).DeliveryAddress.Value.impl_.data_ + 8) = 0;
      *(undefined8 *)((long)&(this_00->S2C).DeliveryAddress.Value.impl_.data_ + 0x10) = 0;
      *(undefined8 *)&(this_00->S2C).DeliveryAddress.Value.impl_.data_ = 2;
      (this_00->S2C).QueueLock.cs.super___recursive_mutex_base._M_mutex.__data.__list.__next =
           (__pthread_internal_list *)0x0;
      *(undefined1 (*) [32])&(this_00->S2C).QueueLock.cs.super___recursive_mutex_base._M_mutex =
           auVar4;
      (this_00->S2C).QueueLock.cs.super___recursive_mutex_base._M_mutex.__data.__kind = 1;
      (this_00->S2C).Queue.Head = (QueueNode *)0x0;
      (this_00->S2C).Queue.Tail = (QueueNode *)0x0;
      (this_00->S2C).NextTimerWakeUsec = 0;
      (this_00->S2C).InsertLock.cs.super___recursive_mutex_base._M_mutex.__align = 0;
      *(undefined8 *)((long)&(this_00->S2C).InsertLock.cs.super___recursive_mutex_base._M_mutex + 8)
           = 0;
      *(undefined8 *)
       ((long)&(this_00->S2C).InsertLock.cs.super___recursive_mutex_base._M_mutex + 0x10) = 0;
      (this_00->S2C).InsertLock.cs.super___recursive_mutex_base._M_mutex.__data.__list.__prev =
           (__pthread_internal_list *)0x0;
      (this_00->S2C).InsertLock.cs.super___recursive_mutex_base._M_mutex.__data.__list.__next =
           (__pthread_internal_list *)0x0;
      (this_00->S2C).InsertLock.cs.super___recursive_mutex_base._M_mutex.__data.__kind = 1;
      (this_00->S2C).InBurstLoss = false;
      (this_00->S2C).InBurstReorder = false;
      (this_00->Ticker)._M_t.
      super___uniq_ptr_impl<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_*,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
      .
      super__Head_base<0UL,_asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_*,_false>
      ._M_head_impl =
           (basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
            *)0x0;
      *(undefined1 (*) [32])&(this_00->S2C).NextQueueSlotUsec = auVar4;
      MVar2 = mau::ProxySession::Initialize(this_00,hostname,port,config,channel);
      if (MVar2 == Mau_Success) {
        *proxyOut = (MauProxy)this_00;
        return Mau_Success;
      }
      mau::ProxySession::~ProxySession(this_00);
      operator_delete(this_00);
    }
  }
  *proxyOut = (MauProxy)0x0;
LAB_00106b71:
  DecrementLoggerRefs();
  return MVar2;
}

Assistant:

MAU_EXPORT MauResult mau_proxy_create(
    const MauProxyConfig*    config, ///< [in] Configuration for the socket
    const MauChannelConfig* channel, ///< [in] Channel configuration
    const char*            hostname, ///< [in] Hostname of the server
    uint16_t                   port, ///< [in] UDP Port for the server
    MauProxy*              proxyOut  ///< [out] Created socket, or 0 on failure
)
{
    IncrementLoggerRefs();

    ProxySession* session = nullptr;
    MauResult result = Mau_Error;

    if (!config || !proxyOut)
    {
        MAU_DEBUG_BREAK(); // Invalid input
        result = Mau_InvalidInput;
        goto OnError;
    }

    if (config->Version != MAU_VERSION)
    {
        MAU_DEBUG_BREAK(); // Invalid input
        result = Mau_InvalidInput;
        goto OnError;
    }

    if (!ValidateMauProxyConfig(*config))
    {
        MAU_DEBUG_BREAK(); // Invalid input
        result = Mau_InvalidInput;
        goto OnError;
    }

    if (!ValidateMauChannelConfig(*channel))
    {
        MAU_DEBUG_BREAK(); // Invalid input
        result = Mau_InvalidInput;
        goto OnError;
    }

    session = new (std::nothrow) ProxySession;
    if (!session)
    {
        MAU_DEBUG_BREAK(); // Out of memory
        result = Mau_OOM;
        goto OnError;
    }

    result = session->Initialize(hostname, port, *config, *channel);
    if (MAU_FAILED(result))
    {
        delete session;
        session = nullptr;
        goto OnError;
    }

OnError:
    if (proxyOut)
        *proxyOut = reinterpret_cast<MauProxy>(session);

    if (!session)
        DecrementLoggerRefs();

    return result;
}